

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::anon_unknown_8::LogFileObject::Write
          (LogFileObject *this,bool force_flush,time_point *timestamp,char *message,
          size_t message_len)

{
  long lVar1;
  pointer pbVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int32 iVar7;
  int __fd;
  long *plVar8;
  ostream *poVar9;
  string *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  ulong uVar12;
  ostream *poVar13;
  int *piVar14;
  uint32 uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *log_dir;
  pointer __lhs;
  char *pcVar16;
  time_t t;
  string uidname;
  string local_5f0;
  tm tm_time;
  ScopedExit<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_sergiud[P]glog_src_logging_cc:1096:22)>
  local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string hostname;
  undefined1 auStack_3c8 [152];
  string stripped_filename;
  undefined1 auStack_250 [168];
  ostringstream time_pid_stream;
  undefined1 auStack_c8 [152];
  
  std::mutex::lock(&this->mutex_);
  if ((this->base_filename_selected_ == true) && ((this->base_filename_)._M_string_length == 0))
  goto LAB_0010ca45;
  local_598.functor_.current_time = (time_point)(timestamp->__d).__r;
  uVar6 = 1;
  if (fLU::FLAGS_max_log_size - 1 < 0xfff) {
    uVar6 = fLU::FLAGS_max_log_size;
  }
  local_598.functor_.this = this;
  if (this->file_length_ >> 0x14 < uVar6) {
    bVar5 = glog_internal_namespace_::PidHasChanged();
    if (bVar5) goto LAB_0010c0b0;
  }
  else {
LAB_0010c0b0:
    std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
              ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)&this->file_,
               (pointer)0x0);
    this->bytes_since_flush_ = 0;
    this->dropped_mem_length_ = 0;
    this->file_length_ = 0;
    this->rollover_attempt_ = 0x1f;
  }
  if ((this->file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl == (_IO_FILE *)0x0) {
    uVar6 = this->rollover_attempt_ + 1;
    this->rollover_attempt_ = uVar6;
    if (uVar6 == 0x20) {
      this->rollover_attempt_ = 0;
      t = (timestamp->__d).__r / 1000000000;
      if (fLB::FLAGS_log_utc_time == '\x01') {
        gmtime_r(&t,(tm *)&tm_time);
      }
      else {
        localtime_r(&t,(tm *)&tm_time);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&time_pid_stream);
      lVar1 = *(long *)(_time_pid_stream + -0x18);
      std::ios::fill();
      auStack_c8[lVar1] = 0x30;
      plVar8 = (long *)std::ostream::operator<<(&time_pid_stream,tm_time.tm_year + 0x76c);
      *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
      plVar8 = (long *)std::ostream::operator<<(plVar8,tm_time.tm_mon + 1);
      *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
      poVar9 = (ostream *)std::ostream::operator<<(plVar8,tm_time.tm_mday);
      poVar9 = std::operator<<(poVar9,'-');
      *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
      plVar8 = (long *)std::ostream::operator<<(poVar9,tm_time.tm_hour);
      *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
      plVar8 = (long *)std::ostream::operator<<(plVar8,tm_time.tm_min);
      *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
      poVar9 = (ostream *)std::ostream::operator<<(plVar8,tm_time.tm_sec);
      poVar9 = std::operator<<(poVar9,'.');
      iVar7 = glog_internal_namespace_::GetMainThreadPid();
      std::ostream::operator<<(poVar9,iVar7);
      std::__cxx11::stringbuf::str();
      if (this->base_filename_selected_ == true) {
        bVar5 = CreateLogfile(this,&local_5f0);
        if (!bVar5) {
          perror("Could not create log file");
          fprintf(_stderr,"COULD NOT CREATE LOGFILE \'%s\'!\n",local_5f0._M_dataplus._M_p);
LAB_0010ca1c:
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&time_pid_stream);
          goto LAB_0010ca33;
        }
      }
      else {
        pcVar16 = glog_internal_namespace_::ProgramInvocationShortName();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stripped_filename,pcVar16,(allocator<char> *)&hostname);
        hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
        hostname._M_string_length = 0;
        hostname.field_2._M_local_buf[0] = '\0';
        GetHostName(&hostname);
        psVar10 = glog_internal_namespace_::MyUserName_abi_cxx11_();
        std::__cxx11::string::string((string *)&uidname,(string *)psVar10);
        if (uidname._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&uidname);
        }
        std::operator+(&local_568,&stripped_filename,'.');
        std::operator+(&local_548,&local_568,&hostname);
        std::operator+(&local_528,&local_548,'.');
        std::operator+(&local_508,&local_528,&uidname);
        std::operator+(&local_4e8,&local_508,".log.");
        std::operator+(&local_588,&local_4e8,
                       *(char **)(LogSeverityNames + (ulong)this->severity_ * 8));
        std::operator+(&local_4c8,&local_588,'.');
        std::__cxx11::string::operator=((string *)&stripped_filename,(string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        pvVar11 = GetLoggingDirectories_abi_cxx11_();
        __lhs = (pvVar11->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (__lhs == pbVar2) {
            perror("Could not create logging file");
            fprintf(_stderr,"COULD NOT CREATE A LOGGINGFILE %s!",local_5f0._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&uidname);
            std::__cxx11::string::~string((string *)&hostname);
            std::__cxx11::string::~string((string *)&stripped_filename);
            goto LAB_0010ca1c;
          }
          std::operator+(&local_588,__lhs,"/");
          std::operator+(&local_4c8,&local_588,&stripped_filename);
          std::__cxx11::string::operator=((string *)&this->base_filename_,(string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_588);
          bVar5 = CreateLogfile(this,&local_5f0);
          __lhs = __lhs + 1;
        } while (!bVar5);
        std::__cxx11::string::~string((string *)&uidname);
        std::__cxx11::string::~string((string *)&hostname);
        std::__cxx11::string::~string((string *)&stripped_filename);
      }
      if (fLB::FLAGS_log_file_header == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&hostname);
        lVar1 = *(long *)(hostname._M_dataplus._M_p + -0x18);
        std::ios::fill();
        auStack_3c8[lVar1] = 0x30;
        poVar9 = std::operator<<((ostream *)&hostname,"Log file created at: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_year + 0x76c);
        poVar9 = std::operator<<(poVar9,'/');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_mon + 1);
        poVar9 = std::operator<<(poVar9,'/');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_mday);
        poVar9 = std::operator<<(poVar9,' ');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_hour);
        poVar9 = std::operator<<(poVar9,':');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_min);
        poVar9 = std::operator<<(poVar9,':');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_sec);
        pcVar16 = "\n";
        if (fLB::FLAGS_log_utc_time != '\0') {
          pcVar16 = " UTC\n";
        }
        poVar9 = std::operator<<(poVar9,pcVar16);
        poVar9 = std::operator<<(poVar9,"Running on machine: ");
        LogDestination::hostname_abi_cxx11_();
        poVar9 = std::operator<<(poVar9,(string *)LogDestination::hostname__abi_cxx11_);
        std::operator<<(poVar9,'\n');
        if ((anonymous_namespace)::g_application_fingerprint_abi_cxx11_._8_8_ != 0) {
          poVar9 = std::operator<<((ostream *)&hostname,"Application fingerprint: ");
          poVar9 = std::operator<<(poVar9,(string *)
                                          (anonymous_namespace)::
                                          g_application_fingerprint_abi_cxx11_);
          std::operator<<(poVar9,'\n');
        }
        pcVar16 = "mmdd hh:mm:ss.uuuuuu";
        if (fLB::FLAGS_log_year_in_prefix != '\0') {
          pcVar16 = "yyyymmdd hh:mm:ss.uuuuuu";
        }
        poVar9 = std::operator<<((ostream *)&hostname,"Running duration (h:mm:ss): ");
        uVar12 = ((timestamp->__d).__r - (this->start_time_).__d.__r) / 1000000000;
        std::__cxx11::stringstream::stringstream((stringstream *)&stripped_filename);
        uVar6 = (int)uVar12 >> 0x1f;
        uVar3 = (ulong)uVar6 << 0x20 | uVar12 & 0xffffffff;
        uVar4 = (long)uVar3 / 0x3c;
        lVar1 = *(long *)(stripped_filename._M_dataplus._M_p + -0x18);
        std::ios::fill();
        auStack_250[lVar1] = 0x30;
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            (&stripped_filename.field_2,
                             (int)((long)((ulong)uVar6 << 0x20 | uVar12 & 0xffffffff) / 0xe10));
        poVar13 = std::operator<<(poVar13,':');
        *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            (poVar13,(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 |
                                                 uVar4 & 0xffffffff) % 0x3c));
        poVar13 = std::operator<<(poVar13,':');
        *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
        std::ostream::operator<<(poVar13,(int)((long)uVar3 % 0x3c));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)&stripped_filename);
        poVar9 = std::operator<<(poVar9,(string *)&uidname);
        poVar9 = std::operator<<(poVar9,'\n');
        poVar9 = std::operator<<(poVar9,"Log line format: [IWEF]");
        poVar9 = std::operator<<(poVar9,pcVar16);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,"threadid file:line] msg");
        std::operator<<(poVar9,'\n');
        std::__cxx11::string::~string((string *)&uidname);
        std::__cxx11::stringbuf::str();
        fwrite(stripped_filename._M_dataplus._M_p,1,stripped_filename._M_string_length,
               (FILE *)(this->file_)._M_t.
                       super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                       super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                       super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
        this->file_length_ = this->file_length_ + (int)stripped_filename._M_string_length;
        this->bytes_since_flush_ =
             this->bytes_since_flush_ + (int)stripped_filename._M_string_length;
        std::__cxx11::string::~string((string *)&stripped_filename);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hostname);
      }
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&time_pid_stream);
      goto LAB_0010c8c1;
    }
  }
  else {
LAB_0010c8c1:
    if (stop_writing == '\0') {
      piVar14 = __errno_location();
      *piVar14 = 0;
      fwrite(message,1,message_len,
             (FILE *)(this->file_)._M_t.
                     super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if ((fLB::FLAGS_stop_logging_if_full_disk == '\x01') && (*piVar14 == 0x1c)) {
        stop_writing = '\x01';
      }
      else {
        this->file_length_ = this->file_length_ + (int)message_len;
        uVar6 = (int)message_len + this->bytes_since_flush_;
        this->bytes_since_flush_ = uVar6;
        if ((999999 < uVar6 || force_flush) ||
           ((this->next_flush_time_).__d.__r <= (timestamp->__d).__r)) {
          FlushUnlocked(this,timestamp);
          if ((fLB::FLAGS_drop_log_memory == '\x01') && (0x2fffff < this->file_length_)) {
            uVar15 = (this->file_length_ & 0xfff00000) - 0x100000;
            uVar6 = uVar15 - this->dropped_mem_length_;
            if (0x1fffff < uVar6) {
              __fd = fileno((FILE *)(this->file_)._M_t.
                                    super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>
                                    .super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
              posix_fadvise(__fd,(ulong)this->dropped_mem_length_,(ulong)uVar6,4);
              this->dropped_mem_length_ = uVar15;
            }
          }
        }
      }
    }
    else if ((this->next_flush_time_).__d.__r <= (timestamp->__d).__r) {
      stop_writing = '\0';
    }
  }
LAB_0010ca33:
  glog_internal_namespace_::
  ScopedExit<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc:1096:22)>
  ::~ScopedExit(&local_598);
LAB_0010ca45:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void LogFileObject::Write(
    bool force_flush, const std::chrono::system_clock::time_point& timestamp,
    const char* message, size_t message_len) {
  std::lock_guard<std::mutex> l{mutex_};

  // We don't log if the base_name_ is "" (which means "don't write")
  if (base_filename_selected_ && base_filename_.empty()) {
    return;
  }

  auto cleanupLogs = [this, current_time = timestamp] {
    if (log_cleaner.enabled()) {
      log_cleaner.Run(current_time, base_filename_selected_, base_filename_,
                      filename_extension_);
    }
  };

  // Remove old logs
  ScopedExit<decltype(cleanupLogs)> cleanupAtEnd{cleanupLogs};

  if (file_length_ >> 20U >= MaxLogSize() || PidHasChanged()) {
    file_ = nullptr;
    file_length_ = bytes_since_flush_ = dropped_mem_length_ = 0;
    rollover_attempt_ = kRolloverAttemptFrequency - 1;
  }

  // If there's no destination file, make one before outputting
  if (file_ == nullptr) {
    // Try to rollover the log file every 32 log messages.  The only time
    // this could matter would be when we have trouble creating the log
    // file.  If that happens, we'll lose lots of log messages, of course!
    if (++rollover_attempt_ != kRolloverAttemptFrequency) return;
    rollover_attempt_ = 0;

    struct ::tm tm_time;
    std::time_t t = std::chrono::system_clock::to_time_t(timestamp);

    if (FLAGS_log_utc_time) {
      gmtime_r(&t, &tm_time);
    } else {
      localtime_r(&t, &tm_time);
    }

    // The logfile's filename will have the date/time & pid in it
    ostringstream time_pid_stream;
    time_pid_stream.fill('0');
    time_pid_stream << 1900 + tm_time.tm_year << setw(2) << 1 + tm_time.tm_mon
                    << setw(2) << tm_time.tm_mday << '-' << setw(2)
                    << tm_time.tm_hour << setw(2) << tm_time.tm_min << setw(2)
                    << tm_time.tm_sec << '.' << GetMainThreadPid();
    const string& time_pid_string = time_pid_stream.str();

    if (base_filename_selected_) {
      if (!CreateLogfile(time_pid_string)) {
        perror("Could not create log file");
        fprintf(stderr, "COULD NOT CREATE LOGFILE '%s'!\n",
                time_pid_string.c_str());
        return;
      }
    } else {
      // If no base filename for logs of this severity has been set, use a
      // default base filename of
      // "<program name>.<hostname>.<user name>.log.<severity level>.".  So
      // logfiles will have names like
      // webserver.examplehost.root.log.INFO.19990817-150000.4354, where
      // 19990817 is a date (1999 August 17), 150000 is a time (15:00:00),
      // and 4354 is the pid of the logging process.  The date & time reflect
      // when the file was created for output.
      //
      // Where does the file get put?  Successively try the directories
      // "/tmp", and "."
      string stripped_filename(
          glog_internal_namespace_::ProgramInvocationShortName());
      string hostname;
      GetHostName(&hostname);

      string uidname = MyUserName();
      // We should not call CHECK() here because this function can be
      // called after holding on to log_mutex. We don't want to
      // attempt to hold on to the same mutex, and get into a
      // deadlock. Simply use a name like invalid-user.
      if (uidname.empty()) uidname = "invalid-user";

      stripped_filename = stripped_filename + '.' + hostname + '.' + uidname +
                          ".log." + LogSeverityNames[severity_] + '.';
      // We're going to (potentially) try to put logs in several different dirs
      const vector<string>& log_dirs = GetLoggingDirectories();

      // Go through the list of dirs, and try to create the log file in each
      // until we succeed or run out of options
      bool success = false;
      for (const auto& log_dir : log_dirs) {
        base_filename_ = log_dir + "/" + stripped_filename;
        if (CreateLogfile(time_pid_string)) {
          success = true;
          break;
        }
      }
      // If we never succeeded, we have to give up
      if (success == false) {
        perror("Could not create logging file");
        fprintf(stderr, "COULD NOT CREATE A LOGGINGFILE %s!",
                time_pid_string.c_str());
        return;
      }
    }

    // Write a header message into the log file
    if (FLAGS_log_file_header) {
      ostringstream file_header_stream;
      file_header_stream.fill('0');
      file_header_stream << "Log file created at: " << 1900 + tm_time.tm_year
                         << '/' << setw(2) << 1 + tm_time.tm_mon << '/'
                         << setw(2) << tm_time.tm_mday << ' ' << setw(2)
                         << tm_time.tm_hour << ':' << setw(2) << tm_time.tm_min
                         << ':' << setw(2) << tm_time.tm_sec
                         << (FLAGS_log_utc_time ? " UTC\n" : "\n")
                         << "Running on machine: " << LogDestination::hostname()
                         << '\n';

      if (!g_application_fingerprint.empty()) {
        file_header_stream << "Application fingerprint: "
                           << g_application_fingerprint << '\n';
      }
      const char* const date_time_format = FLAGS_log_year_in_prefix
                                               ? "yyyymmdd hh:mm:ss.uuuuuu"
                                               : "mmdd hh:mm:ss.uuuuuu";
      file_header_stream
          << "Running duration (h:mm:ss): "
          << PrettyDuration(
                 std::chrono::duration_cast<std::chrono::duration<int>>(
                     timestamp - start_time_))
          << '\n'
          << "Log line format: [IWEF]" << date_time_format << " "
          << "threadid file:line] msg" << '\n';
      const string& file_header_string = file_header_stream.str();

      const size_t header_len = file_header_string.size();
      fwrite(file_header_string.data(), 1, header_len, file_.get());
      file_length_ += header_len;
      bytes_since_flush_ += header_len;
    }
  }

  // Write to LOG file
  if (!stop_writing) {
    // fwrite() doesn't return an error when the disk is full, for
    // messages that are less than 4096 bytes. When the disk is full,
    // it returns the message length for messages that are less than
    // 4096 bytes. fwrite() returns 4096 for message lengths that are
    // greater than 4096, thereby indicating an error.
    errno = 0;
    fwrite(message, 1, message_len, file_.get());
    if (FLAGS_stop_logging_if_full_disk &&
        errno == ENOSPC) {  // disk full, stop writing to disk
      stop_writing = true;  // until the disk is
      return;
    } else {
      file_length_ += message_len;
      bytes_since_flush_ += message_len;
    }
  } else {
    if (timestamp >= next_flush_time_) {
      stop_writing = false;  // check to see if disk has free space.
    }
    return;  // no need to flush
  }

  // See important msgs *now*.  Also, flush logs at least every 10^6 chars,
  // or every "FLAGS_logbufsecs" seconds.
  if (force_flush || (bytes_since_flush_ >= 1000000) ||
      (timestamp >= next_flush_time_)) {
    FlushUnlocked(timestamp);
#ifdef GLOG_OS_LINUX
    // Only consider files >= 3MiB
    if (FLAGS_drop_log_memory && file_length_ >= (3U << 20U)) {
      // Don't evict the most recent 1-2MiB so as not to impact a tailer
      // of the log file and to avoid page rounding issue on linux < 4.7
      uint32 total_drop_length =
          (file_length_ & ~((1U << 20U) - 1U)) - (1U << 20U);
      uint32 this_drop_length = total_drop_length - dropped_mem_length_;
      if (this_drop_length >= (2U << 20U)) {
        // Only advise when >= 2MiB to drop
#  if defined(__ANDROID__) && defined(__ANDROID_API__) && (__ANDROID_API__ < 21)
        // 'posix_fadvise' introduced in API 21:
        // * https://android.googlesource.com/platform/bionic/+/6880f936173081297be0dc12f687d341b86a4cfa/libc/libc.map.txt#732
#  else
        posix_fadvise(
            fileno(file_.get()), static_cast<off_t>(dropped_mem_length_),
            static_cast<off_t>(this_drop_length), POSIX_FADV_DONTNEED);
#  endif
        dropped_mem_length_ = total_drop_length;
      }
    }
#endif
  }
}